

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_translateasttobytecode
                   (HSQUIRRELVM v,SqASTData *astData,HSQOBJECT *bindings,SQChar *s,SQInteger size,
                   SQBool raiseerror,SQBool debugInfo)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQRESULT SVar3;
  SQObjectPtr o;
  SQObjectPtr local_20;
  
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._flags = '\0';
  o.super_SQObject._5_3_ = 0;
  bVar2 = SQCompilation::TranslateASTToBytecode
                    (v,astData,bindings,s,size,&o,raiseerror != 0,debugInfo != 0);
  SVar3 = -1;
  if (bVar2) {
    local_20.super_SQObject._unVal.pClosure =
         SQClosure::Create(v->_sharedstate,o.super_SQObject._unVal.pFunctionProto);
    local_20.super_SQObject._type = OT_CLOSURE;
    local_20.super_SQObject._flags = '\0';
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_20);
    SQObjectPtr::~SQObjectPtr(&local_20);
    SVar3 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar3;
}

Assistant:

SQRESULT sq_translateasttobytecode(HSQUIRRELVM v, SQCompilation::SqASTData *astData, const HSQOBJECT *bindings, const SQChar *s, SQInteger size, SQBool raiseerror, SQBool debugInfo)
{
    SQObjectPtr o;
    if (TranslateASTToBytecode(v, astData, bindings, s, size, o, raiseerror, debugInfo))
    {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o)));
        return SQ_OK;
    }
    return SQ_ERROR;
}